

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChArchive.h
# Opt level: O1

void __thiscall chrono::ChArchiveOut::out_version(ChArchiveOut *this,int mver,type_info *mtype)

{
  ChClassFactory *this_00;
  string *psVar1;
  size_type sVar2;
  string class_name_polished;
  int local_74;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  pointer local_30;
  int *local_28;
  undefined1 local_20;
  
  if ((this->super_ChArchive).use_versions == true) {
    local_74 = mver;
    this_00 = (ChClassFactory *)chrono::ChClassFactory::GetGlobalClassFactory();
    psVar1 = ChClassFactory::_GetClassTagName_abi_cxx11_(this_00,mtype);
    std::__cxx11::string::string
              ((string *)&local_70,(psVar1->_M_dataplus)._M_p,(allocator *)&local_50);
    if (local_70._M_string_length != 0) {
      sVar2 = 0;
      do {
        if (local_70._M_dataplus._M_p[sVar2] == '<') {
          local_70._M_dataplus._M_p[sVar2] = '[';
        }
        sVar2 = sVar2 + 1;
      } while (local_70._M_string_length != sVar2);
    }
    if (local_70._M_string_length != 0) {
      sVar2 = 0;
      do {
        if (local_70._M_dataplus._M_p[sVar2] == '>') {
          local_70._M_dataplus._M_p[sVar2] = ']';
        }
        sVar2 = sVar2 + 1;
      } while (local_70._M_string_length != sVar2);
    }
    if (local_70._M_string_length != 0) {
      sVar2 = 0;
      do {
        if (local_70._M_dataplus._M_p[sVar2] == ' ') {
          local_70._M_dataplus._M_p[sVar2] = '_';
        }
        sVar2 = sVar2 + 1;
      } while (local_70._M_string_length != sVar2);
    }
    std::operator+(&local_50,"_version_",&local_70);
    local_30 = local_50._M_dataplus._M_p;
    local_28 = &local_74;
    local_20 = 0;
    (*(this->super_ChArchive)._vptr_ChArchive[3])(this);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
  }
  return;
}

Assistant:

virtual void out_version(int mver, const std::type_info& mtype) {
          if (use_versions) {
              const char* class_name = "";
                  try {
                      class_name = ChClassFactory::GetClassTagName(mtype).c_str(); // registered
                  } catch(const ChException &) {   
                      class_name = mtype.name();
                  }
				  std::string class_name_polished = class_name;
				  // to avoid troubles in xml archives
				  std::replace(class_name_polished.begin(), class_name_polished.end(), '<', '[');
				  std::replace(class_name_polished.begin(), class_name_polished.end(), '>', ']');
				  std::replace(class_name_polished.begin(), class_name_polished.end(), ' ', '_');
              this->out(ChNameValue<int>(("_version_" + class_name_polished).c_str(), mver));
          }
      }